

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void check_pseudo_is_top(Proc *proc,Pseudo *pseudo)

{
  AstNode *expr;
  AstNode *expr_00;
  C_MemoryAllocator *pCVar1;
  ulong uVar2;
  BasicBlock *bb_to_start;
  BasicBlock *bb_to_start_00;
  Pseudo *pPVar3;
  Pseudo *pPVar4;
  BasicBlock *false_block;
  int i;
  uint uVar5;
  uint uVar6;
  int extraout_EDX;
  BasicBlock *true_block;
  uint uVar7;
  int iVar8;
  Proc *proc_00;
  bool bVar9;
  
  uVar7 = *(uint *)pseudo;
  if ((uVar7 >> 0x14 & 1) != 0) {
    __assert_fail("!pseudo->freed",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0xc5,"void check_pseudo_is_top(Proc *, Pseudo *)");
  }
  uVar5 = (uVar7 & 0xf) - 1;
  if (((10 < uVar5) || ((0x40fU >> (uVar5 & 0x1f) & 1) == 0)) ||
     ((pseudo->field_3).symbol != (LuaSymbol *)0x0)) {
    return;
  }
  uVar6 = 3;
  iVar8 = -0xbf;
  do {
    uVar2 = *(ulong *)((long)(proc->local_pseudos).bits +
                      (ulong)uVar6 * 8 + *(long *)(&DAT_00138498 + (ulong)uVar5 * 8) + -0x58);
    if (uVar2 != 0) {
      proc_00 = (Proc *)(ulong)(uint)-iVar8;
      do {
        proc_00 = (Proc *)(ulong)((int)proc_00 + 1);
        bVar9 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar9);
      goto LAB_0011b166;
    }
    iVar8 = iVar8 + 0x40;
    bVar9 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar9);
  proc_00 = (Proc *)0xffffffff;
LAB_0011b166:
  if ((int)(uint)proc_00 < 0) {
    return;
  }
  uVar7 = uVar7 >> 4 & 0xffff;
  uVar2 = (ulong)uVar7;
  if ((uint)proc_00 == uVar7) {
    return;
  }
  check_pseudo_is_top_cold_1();
  expr = *(AstNode **)(uVar2 + 0x20);
  expr_00 = *(AstNode **)(uVar2 + 0x28);
  bb_to_start = create_block(proc_00);
  bb_to_start_00 = create_block(proc_00);
  pPVar3 = allocate_temp_pseudo(proc_00,RAVI_TANY,true);
  pPVar4 = linearize_expression(proc_00,expr);
  instruct_move(proc_00,op_mov,pPVar3,pPVar4,*(uint *)(uVar2 + 4));
  free_temp_pseudo(proc_00,pPVar4,false);
  false_block = bb_to_start;
  true_block = bb_to_start_00;
  if (extraout_EDX != 0) {
    false_block = bb_to_start_00;
    true_block = bb_to_start;
  }
  instruct_cbr(proc_00,pPVar3,true_block,false_block,*(uint *)(uVar2 + 4));
  start_block(proc_00,bb_to_start,*(uint *)(uVar2 + 4));
  pPVar4 = linearize_expression(proc_00,expr_00);
  instruct_move(proc_00,op_mov,pPVar3,pPVar4,*(uint *)(uVar2 + 4));
  free_temp_pseudo(proc_00,pPVar4,false);
  pCVar1 = proc_00->linearizer->compiler_state->allocator;
  pPVar3 = (Pseudo *)(*pCVar1->calloc)(pCVar1->arena,1,0x30);
  *(uint *)pPVar3 = *(uint *)pPVar3 & 0xfffffff0 | 10;
  (pPVar3->field_3).block = bb_to_start_00;
  instruct_br(proc_00,pPVar3,*(uint *)(uVar2 + 4));
  start_block(proc_00,bb_to_start_00,*(uint *)(uVar2 + 4));
  return;
}

Assistant:

static void check_pseudo_is_top(Proc *proc, Pseudo *pseudo) {
	PseudoGenerator *gen;
	assert(!pseudo->freed);
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		break;
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (pseudo->temp_for_local)
		return;
	int top = top_reg(gen);
	if (top < 0)
		return;
	if (top != pseudo->regnum) {
		fprintf(stderr, "Top expected %u, found %u\n", top, pseudo->regnum);
		assert(false);
	}
}